

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDAGetSensConsistentIC(void *ida_mem,N_Vector *yyS0,N_Vector *ypS0)

{
  long in_RDX;
  long in_RSI;
  IDAMem in_RDI;
  int is;
  IDAMem IDA_mem;
  int local_2c;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x774,"IDAGetSensConsistentIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensi == 0) {
    IDAProcessError(in_RDI,-0x28,0x77c,"IDAGetSensConsistentIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else if (in_RDI->ida_kused == 0) {
    if (in_RSI != 0) {
      for (local_2c = 0; local_2c < in_RDI->ida_Ns; local_2c = local_2c + 1) {
        N_VScale(0x3ff0000000000000,in_RDI->ida_phiS[0][local_2c],
                 *(undefined8 *)(in_RSI + (long)local_2c * 8));
      }
    }
    if (in_RDX != 0) {
      for (local_2c = 0; local_2c < in_RDI->ida_Ns; local_2c = local_2c + 1) {
        N_VScale(0x3ff0000000000000,in_RDI->ida_phiS[1][local_2c],
                 *(undefined8 *)(in_RDX + (long)local_2c * 8));
      }
    }
    local_4 = 0;
  }
  else {
    IDAProcessError(in_RDI,-0x16,0x783,"IDAGetSensConsistentIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"IDAGetConsistentIC can only be called before IDASolve.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDAGetSensConsistentIC(void* ida_mem, N_Vector* yyS0, N_Vector* ypS0)
{
  IDAMem IDA_mem;
  int is;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  if (IDA_mem->ida_kused != 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_TOO_LATE);
    return (IDA_ILL_INPUT);
  }

  if (yyS0 != NULL)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_phiS[0][is], yyS0[is]);
    }
  }

  if (ypS0 != NULL)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_phiS[1][is], ypS0[is]);
    }
  }

  return (IDA_SUCCESS);
}